

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_perftest.cc
# Opt level: O0

int main(void)

{
  int64_t iVar1;
  float *pfVar2;
  uint *puVar3;
  size_type sVar4;
  reference pvVar5;
  float local_184;
  ulong local_168;
  size_t i_1;
  uint local_158;
  float total;
  int max;
  int min;
  int delta;
  int i;
  uint64_t slash_bits;
  int64_t local_130;
  int64_t start;
  int kNumRepetitions;
  int j;
  size_t len;
  char buf [200];
  undefined1 local_48 [8];
  string err;
  vector<int,_std::allocator<int>_> times;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_48);
  _kNumRepetitions = 0x4e;
  strcpy((char *)&len,
         "../../third_party/WebKit/Source/WebCore/platform/leveldb/LevelDBWriteBatch.cpp");
  for (start._4_4_ = 0; start._4_4_ < 5; start._4_4_ = start._4_4_ + 1) {
    start._0_4_ = 2000000;
    local_130 = GetTimeMillis();
    for (min = 0; min < 2000000; min = min + 1) {
      CanonicalizePath((char *)&len,(size_t *)&kNumRepetitions,(uint64_t *)&delta,(string *)local_48
                      );
    }
    iVar1 = GetTimeMillis();
    max = (int)iVar1 - (int)local_130;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),&max);
  }
  pfVar2 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),0);
  total = *pfVar2;
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),0);
  local_158 = *puVar3;
  i_1._4_4_ = 0.0;
  for (local_168 = 0;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8)),
      local_168 < sVar4; local_168 = local_168 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),local_168);
    i_1._4_4_ = (float)*pvVar5 + i_1._4_4_;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),local_168);
    if (*pvVar5 < (int)total) {
      pfVar2 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),
                                   local_168);
      total = *pfVar2;
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),local_168);
      if ((int)local_158 < *pvVar5) {
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8),
                                    local_168);
        local_158 = *puVar3;
      }
    }
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
  local_184 = (float)sVar4;
  printf("min %dms  max %dms  avg %.1fms\n",(double)(i_1._4_4_ / local_184),(ulong)(uint)total,
         (ulong)local_158);
  std::__cxx11::string::~string((string *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)((long)&err.field_2 + 8));
  return 0;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  char buf[200];
  size_t len = strlen(kPath);
  strcpy(buf, kPath);

  for (int j = 0; j < 5; ++j) {
    const int kNumRepetitions = 2000000;
    int64_t start = GetTimeMillis();
    uint64_t slash_bits;
    for (int i = 0; i < kNumRepetitions; ++i) {
      CanonicalizePath(buf, &len, &slash_bits, &err);
    }
    int delta = (int)(GetTimeMillis() - start);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());
}